

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmCachePolicyCommon.cpp
# Opt level: O0

MEMORY_OBJECT_CONTROL_STATE __thiscall
GmmLib::GmmCachePolicyCommon::CachePolicyGetMemoryObject
          (GmmCachePolicyCommon *this,GMM_RESOURCE_INFO *pResInfo,GMM_RESOURCE_USAGE_TYPE Usage)

{
  uint uVar1;
  uint uVar2;
  GMM_CACHE_POLICY_ELEMENT *pGVar3;
  GMM_CACHE_POLICY_ELEMENT *CachePolicy;
  GMM_RESOURCE_USAGE_TYPE Usage_local;
  GMM_RESOURCE_INFO *pResInfo_local;
  GmmCachePolicyCommon *this_local;
  
  pGVar3 = Context::GetCachePolicyUsage(this->pGmmLibContext);
  if (pResInfo != (GMM_RESOURCE_INFO *)0x0) {
    (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
    uVar1 = pGVar3[Usage].Override;
    uVar2 = (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x5e])();
    if (((uVar1 & pGVar3[uVar2].IDCode) == 0) && (pGVar3[Usage].Override != 0xffffffff)) {
      return (MEMORY_OBJECT_CONTROL_STATE)pGVar3[Usage].field_3.MemoryObjectNoOverride.DwordValue;
    }
  }
  return (MEMORY_OBJECT_CONTROL_STATE)pGVar3[Usage].MemoryObjectOverride.DwordValue;
}

Assistant:

MEMORY_OBJECT_CONTROL_STATE GMM_STDCALL GmmLib::GmmCachePolicyCommon::CachePolicyGetMemoryObject(GMM_RESOURCE_INFO *pResInfo, GMM_RESOURCE_USAGE_TYPE Usage)
{
    const GMM_CACHE_POLICY_ELEMENT *CachePolicy = NULL;
    __GMM_ASSERT(pGmmLibContext->GetCachePolicyElement(Usage).Initialized);
    CachePolicy = pGmmLibContext->GetCachePolicyUsage();
    // Prevent wrong Usage for XAdapter resources. UMD does not call GetMemoryObject on shader resources but,
    // when they add it someone could call it without knowing the restriction.
    if(pResInfo &&
       pResInfo->GetResFlags().Info.XAdapter &&
       (Usage != GMM_RESOURCE_USAGE_XADAPTER_SHARED_RESOURCE))
    {
        __GMM_ASSERT(false);
    }

    if(!pResInfo ||
       (CachePolicy[Usage].Override & CachePolicy[pResInfo->GetCachePolicyUsage()].IDCode) ||
       (CachePolicy[Usage].Override == ALWAYS_OVERRIDE))
    {
        return CachePolicy[Usage].MemoryObjectOverride;
    }
    else
    {
        return CachePolicy[Usage].MemoryObjectNoOverride;
    }
}